

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O2

intptr_t fiobj_data_i(FIOBJ o)

{
  int iVar1;
  int *piVar2;
  stat sStack_a8;
  
  if (0xfffffffd < *(uint *)(o + 0x30)) {
    return *(intptr_t *)(o + 0x20);
  }
  do {
    iVar1 = fstat(*(int *)(o + 0x30),&sStack_a8);
    if (iVar1 == 0) {
      return sStack_a8.st_size;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  return -1;
}

Assistant:

static intptr_t fiobj_data_i(const FIOBJ o) {
  switch (obj2io(o)->fd) {
  case -1:
  case -2:
    return obj2io(o)->len;
    break;
  default:
    return fiobj_data_get_fd_size(o);
  }
}